

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::InitAllocated
          (ArenaStringPtr *this,string *str,Arena *arena)

{
  ArenaStringPtr local_10 [2];
  
  if (arena == (Arena *)0x0) {
    if (str != (string *)0x0) {
      if (((ulong)str & 3) == 0) {
        (this->tagged_ptr_).ptr_ = (void *)((ulong)str | 2);
        return;
      }
      goto LAB_00a5d914;
    }
  }
  else {
    if (str == (string *)0x0) {
      InitAllocated(local_10);
    }
    else if (((ulong)str & 3) == 0) {
      (this->tagged_ptr_).ptr_ = (void *)((ulong)str | 3);
      ThreadSafeArena::AddCleanup(&arena->impl_,str,arena_delete_object<std::__cxx11::string>);
      return;
    }
    InitAllocated();
  }
  InitAllocated(local_10);
LAB_00a5d914:
  InitAllocated();
}

Assistant:

inline void ArenaStringPtr::InitAllocated(std::string* str, Arena* arena) {
  if (arena != nullptr) {
    tagged_ptr_.SetMutableArena(str);
    arena->Own(str);
  } else {
    tagged_ptr_.SetAllocated(str);
  }
}